

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_server_test.cc
# Opt level: O2

void __thiscall xLearn::KVStoreTest_FeatMap_Test::TestBody(KVStoreTest_FeatMap_Test *this)

{
  char *pcVar1;
  AssertHelper local_38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar;
  KVStore store;
  
  store._vptr_KVStore = (_func_int **)&PTR_Initialize_00145450;
  store.server_num_ = 3;
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,0);
  local_38.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)0)","(index_t)0",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x2d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,1);
  local_38.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)1)","(index_t)0",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x2e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,2);
  local_38.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)2)","(index_t)0",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x2f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,3);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)3)","(index_t)1",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x30,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,4);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)4)","(index_t)1",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x31,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,5);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)5)","(index_t)1",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,6);
  local_38.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)6)","(index_t)2",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,7);
  local_38.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)7)","(index_t)2",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x34,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,8);
  local_38.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)8)","(index_t)2",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x35,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = KVStore::FeatMap(&store,9);
  local_38.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"store.FeatMap((index_t)9)","(index_t)3",(uint *)&local_30,
             (uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x36,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(KVStoreTest, FeatMap) {
  KVStore store;
  store.Initialize(3);
  EXPECT_EQ(store.FeatMap((index_t)0), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)1), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)2), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)3), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)4), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)5), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)6), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)7), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)8), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)9), (index_t)3);
}